

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_long>
               (uchar **strings,size_t n,size_t depth,vector_bagwell<unsigned_char_*,_16U> *buckets)

{
  uint j;
  long lVar1;
  size_t sVar2;
  uchar **t;
  uint j_1;
  vector_bagwell<unsigned_char_*,_16U> *pvVar3;
  uint i_2;
  uchar **t_00;
  uint i;
  ulong uVar4;
  long lVar5;
  unsigned_long uVar6;
  array<unsigned_long,_256UL> bucketsize;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  t_00 = strings;
  for (uVar4 = 0; uVar4 < (n & 0xffffffffffffffe0); uVar4 = uVar4 + 0x20) {
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      *(uchar *)((long)bucketsize._M_elems + lVar1) = t_00[lVar1][depth];
    }
    t = t_00;
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      vector_bagwell<unsigned_char_*,_16U>::push_back
                (buckets + *(byte *)((long)bucketsize._M_elems + lVar1),t);
      t = t + 1;
    }
    t_00 = t_00 + 0x20;
  }
  for (; uVar4 < n; uVar4 = uVar4 + 1) {
    vector_bagwell<unsigned_char_*,_16U>::push_back(buckets + (*t_00)[depth],t_00);
    t_00 = t_00 + 1;
  }
  pvVar3 = buckets;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    sVar2 = vector_bagwell<unsigned_char_*,_16U>::size(pvVar3);
    bucketsize._M_elems[lVar1] = sVar2;
    pvVar3 = pvVar3 + 1;
  }
  lVar1 = 0;
  pvVar3 = buckets;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar6 = bucketsize._M_elems[lVar5];
    if (uVar6 != 0) {
      copy<unsigned_char*,16u,unsigned_char**>(pvVar3,strings + lVar1);
      lVar1 = lVar1 + uVar6;
    }
    pvVar3 = pvVar3 + 1;
  }
  for (lVar1 = 0; lVar1 != 0x2800; lVar1 = lVar1 + 0x28) {
    vector_bagwell<unsigned_char_*,_16U>::clear
              ((vector_bagwell<unsigned_char_*,_16U> *)
               ((long)&(buckets->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
  }
  uVar6 = bucketsize._M_elems[0];
  for (lVar1 = 1; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    sVar2 = bucketsize._M_elems[lVar1];
    if (sVar2 != 0) {
      msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_long>
                (strings + uVar6,sVar2,depth + 1,buckets);
      uVar6 = uVar6 + sVar2;
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}